

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

int UnityIsOneArrayNull(void *expected,void *actual,UNITY_UINT lineNumber,char *msg)

{
  char *msg_local;
  UNITY_UINT lineNumber_local;
  void *actual_local;
  void *expected_local;
  
  if (expected == actual) {
    expected_local._4_4_ = 0;
  }
  else if (expected == (void *)0x0) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected pointer to be NULL");
    UnityAddMsgIfSpecified(msg);
    expected_local._4_4_ = 1;
  }
  else if (actual == (void *)0x0) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Actual pointer was NULL");
    UnityAddMsgIfSpecified(msg);
    expected_local._4_4_ = 1;
  }
  else {
    expected_local._4_4_ = 0;
  }
  return expected_local._4_4_;
}

Assistant:

static int UnityIsOneArrayNull(UNITY_INTERNAL_PTR expected,
                               UNITY_INTERNAL_PTR actual,
                               const UNITY_LINE_TYPE lineNumber,
                               const char* msg)
{
    /* Both are NULL or same pointer */
    if (expected == actual) { return 0; }

    /* print and return true if just expected is NULL */
    if (expected == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForExpected);
        UnityAddMsgIfSpecified(msg);
        return 1;
    }

    /* print and return true if just actual is NULL */
    if (actual == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForActual);
        UnityAddMsgIfSpecified(msg);
        return 1;
    }

    return 0; /* return false if neither is NULL */
}